

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O1

void __thiscall
helics::apps::Tracer::captureForCurrentTime(Tracer *this,Time currentTime,int iteration)

{
  _Elt_pointer pIVar1;
  bool bVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *paVar3;
  string *psVar4;
  ostream *poVar5;
  logger *plVar6;
  _Map_pointer ppIVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar8;
  _Elt_pointer this_00;
  _Elt_pointer this_01;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string valstr;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_108;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *paStack_100;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_b8;
  pointer pcStack_b0;
  pointer local_a8;
  size_type sStack_a0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_98;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_90;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_88;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_80;
  undefined1 local_78 [32];
  _Elt_pointer local_58;
  undefined1 local_50 [16];
  MessageFederate *local_40;
  _Map_pointer local_38;
  
  local_58 = (_Elt_pointer)CONCAT44(local_58._4_4_,iteration);
  this_00 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar1 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50._0_8_ = currentTime.internalTimeCode;
  if (this_00 != pIVar1) {
    pIVar8 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppIVar7 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_c8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               ((double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
               (double)(currentTime.internalTimeCode / 1000000000));
    local_c0.values_ = (value<fmt::v11::context> *)&this->valueCallback;
    do {
      bVar2 = Input::isUpdated(this_00);
      if (bVar2) {
        Input::getValue_impl<std::__cxx11::string>(&local_108,this_00);
        if (this->printMessage == true) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_e8._M_string_length = 0;
          local_e8.field_2._M_local_buf[0] = '\0';
          paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   &this_00->givenTarget;
          if (paStack_100 < (anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)0x96) {
            if ((int)local_58 < 1) {
              if ((this_00->givenTarget)._M_string_length == 0) {
                paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                         Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
              }
              local_b8 = local_c8;
              local_a8 = (((string *)paVar3)->_M_dataplus)._M_p;
              sStack_a0 = ((string *)paVar3)->_M_string_length;
              local_98.args_ = local_108.args_;
              aStack_90.values_ = (value<fmt::v11::context> *)paStack_100;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)&local_b8;
              fmt_01.size_ = 0xdda;
              fmt_01.data_ = (char *)0xf;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)local_78,(v11 *)"[{}]value {}={}",fmt_01,args_01);
            }
            else {
              if ((this_00->givenTarget)._M_string_length == 0) {
                paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                         Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
              }
              local_b8 = local_c8;
              local_a8 = (pointer)CONCAT44(local_a8._4_4_,(int)local_58);
              local_98 = *paVar3;
              aStack_90 = paVar3[1];
              local_88.args_ = local_108.args_;
              aStack_80.values_ = (value<fmt::v11::context> *)paStack_100;
              args.field_1.values_ = in_R9.values_;
              args.desc_ = (unsigned_long_long)&local_b8;
              fmt.size_ = 0xdd1a;
              fmt.data_ = (char *)0x12;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)local_78,(v11 *)"[{}:{}]value {}={}",fmt,args);
            }
          }
          else if ((int)local_58 < 1) {
            if ((this_00->givenTarget)._M_string_length == 0) {
              paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                       Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
            }
            local_b8 = local_c8;
            local_a8 = (((string *)paVar3)->_M_dataplus)._M_p;
            sStack_a0 = ((string *)paVar3)->_M_string_length;
            local_98.values_ = (value<fmt::v11::context> *)paStack_100;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&local_b8;
            fmt_02.size_ = 0x4da;
            fmt_02.data_ = (char *)0x16;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_78,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02);
          }
          else {
            if ((this_00->givenTarget)._M_string_length == 0) {
              paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                       Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
            }
            local_b8 = local_c8;
            local_a8 = (pointer)CONCAT44(local_a8._4_4_,(int)local_58);
            local_98 = *paVar3;
            aStack_90 = paVar3[1];
            local_88.values_ = (value<fmt::v11::context> *)paStack_100;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)&local_b8;
            fmt_00.size_ = 0x4d1a;
            fmt_00.data_ = (char *)0x19;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_78,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(&local_e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          if ((Message *)local_78._0_8_ != (Message *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          if (this->skiplog == true) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_e8._M_dataplus._M_p,
                                local_e8._M_string_length);
            local_b8._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
          }
          else {
            plVar6 = spdlog::default_logger_raw();
            local_b8.values_ = (value<fmt::v11::context> *)0x0;
            pcStack_b0 = (pointer)0x0;
            local_a8 = (pointer)0x0;
            spdlog::logger::log(plVar6,0.0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                     local_e8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((this->valueCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          if ((this_00->givenTarget)._M_string_length == 0) {
            psVar4 = Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
          }
          else {
            psVar4 = (string *)&this_00->givenTarget;
          }
          __args_2._M_str = (char *)local_108.values_;
          __args_2._M_len = (size_t)paStack_100;
          __args_1._M_str = (psVar4->_M_dataplus)._M_p;
          __args_1._M_len = psVar4->_M_string_length;
          in_R9 = local_108;
          CLI::std::
          function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)local_c0,(TimeRepresentation<count_time<9,_long>_>)local_50._0_8_,__args_1
                       ,__args_2);
        }
        if (&(local_108.values_)->field_0 != &local_f8) {
          operator_delete(local_108.values_,
                          CONCAT71(local_f8.long_long_value._1_7_,local_f8.bool_value) + 1);
        }
      }
      this_00 = this_00 + 1;
      if (this_00 == pIVar8) {
        this_00 = ppIVar7[1];
        ppIVar7 = ppIVar7 + 1;
        pIVar8 = this_00 + 1;
      }
    } while (this_00 != pIVar1);
  }
  this_01 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (this_01 != local_58) {
    local_c0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_38 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_c8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               ((double)((long)local_50._0_8_ % 1000000000) * 1e-09 +
               (double)((long)local_50._0_8_ / 1000000000));
    do {
      while (bVar2 = Endpoint::hasMessage(this_01), bVar2) {
        Endpoint::getMessage((Endpoint *)local_78);
        if (this->printMessage == true) {
          local_108.values_ = (value<fmt::v11::context> *)&local_f8;
          paStack_100 = (anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)0x0;
          local_f8.bool_value = false;
          local_88 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                     ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                     (local_78._0_8_ + 0x50))->values_;
          if ((ulong)local_88 < (anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)0x32) {
            local_b8 = local_c8;
            local_a8 = (((string *)(local_78._0_8_ + 0x90))->_M_dataplus)._M_p;
            sStack_a0 = *(size_type *)(local_78._0_8_ + 0x98);
            local_98 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                        (local_78._0_8_ + 0x70);
            aStack_90 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                         (local_78._0_8_ + 0x78);
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)&local_b8;
            fmt_03.size_ = 0xddda;
            fmt_03.data_ = (char *)0x1d;
            aStack_80 = local_88;
            local_88 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                        (local_78._0_8_ + 0x60);
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&local_e8,(v11 *)"[{}]message from {} to {}::{}",fmt_03,args_03);
          }
          else {
            local_b8 = local_c8;
            local_a8 = (((string *)(local_78._0_8_ + 0x90))->_M_dataplus)._M_p;
            sStack_a0 = *(size_type *)(local_78._0_8_ + 0x98);
            local_98 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                        (local_78._0_8_ + 0x70);
            aStack_90 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                         (local_78._0_8_ + 0x78);
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&local_b8;
            fmt_04.size_ = 0x4dda;
            fmt_04.data_ = (char *)0x23;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&local_e8,(v11 *)"[{}]message from {} to {}:: size {}",fmt_04,
                       args_04);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                    &local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                     local_e8.field_2._M_local_buf[0]) + 1);
          }
          if (this->skiplog == true) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_108.values_,(long)paStack_100);
            local_b8._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
          }
          else {
            plVar6 = spdlog::default_logger_raw();
            local_b8.values_ = (value<fmt::v11::context> *)0x0;
            pcStack_b0 = (pointer)0x0;
            local_a8 = (pointer)0x0;
            spdlog::logger::log(plVar6,0.0);
          }
          if (&(local_108.values_)->field_0 != &local_f8) {
            operator_delete(local_108.values_,
                            CONCAT71(local_f8.long_long_value._1_7_,local_f8.bool_value) + 1);
          }
        }
        if ((this->endpointMessageCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          psVar4 = Interface::getName_abi_cxx11_(&this_01->super_Interface);
          pcStack_b0 = (psVar4->_M_dataplus)._M_p;
          local_b8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                     psVar4->_M_string_length;
          local_40 = (MessageFederate *)local_78._0_8_;
          local_78._0_8_ = (Message *)0x0;
          local_108 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      local_50._0_8_;
          if ((this->endpointMessageCallback).super__Function_base._M_manager == (_Manager_type)0x0)
          {
            std::__throw_bad_function_call();
          }
          (*(this->endpointMessageCallback)._M_invoker)
                    ((_Any_data *)&this->endpointMessageCallback,
                     (TimeRepresentation<count_time<9,_long>_> *)&local_108,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_b8,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_40
                    );
          if (local_40 != (MessageFederate *)0x0) {
            CLI::std::default_delete<helics::Message>::operator()
                      ((default_delete<helics::Message> *)&local_40,(Message *)local_40);
          }
          local_40 = (MessageFederate *)0x0;
        }
        if ((Message *)local_78._0_8_ != (Message *)0x0) {
          CLI::std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)local_78,(Message *)local_78._0_8_);
        }
      }
      this_01 = this_01 + 1;
      if ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)this_01 == local_c0) {
        this_01 = local_38[1];
        local_38 = local_38 + 1;
        local_c0.values_ = (value<fmt::v11::context> *)(this_01 + 4);
      }
    } while (this_01 != local_58);
  }
  if (((this->cloneEndpoint)._M_t.
       super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
       super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
       super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl != (Endpoint *)0x0) &&
     (bVar2 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl), bVar2)) {
    local_c0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               ((double)((long)local_50._0_8_ % 1000000000) * 1e-09 +
               (double)((long)local_50._0_8_ / 1000000000));
    do {
      Endpoint::getMessage((Endpoint *)local_78);
      if (this->printMessage == true) {
        local_108.values_ = (value<fmt::v11::context> *)&local_f8;
        paStack_100 = (anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)0x0;
        local_f8.bool_value = false;
        local_88 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   (local_78._0_8_ + 0x50))->values_;
        if ((ulong)local_88 < (anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)0x32) {
          local_b8 = local_c0;
          local_a8 = (((string *)(local_78._0_8_ + 0x90))->_M_dataplus)._M_p;
          sStack_a0 = *(size_type *)(local_78._0_8_ + 0x98);
          local_98 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                      (local_78._0_8_ + 0xd0);
          aStack_90 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                       (local_78._0_8_ + 0xd8);
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)&local_b8;
          fmt_05.size_ = 0xddda;
          fmt_05.data_ = (char *)0x1d;
          aStack_80 = local_88;
          local_88 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                      (local_78._0_8_ + 0x60);
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_e8,(v11 *)"[{}]message from {} to {}::{}",fmt_05,args_05);
        }
        else {
          local_b8 = local_c0;
          local_a8 = (((string *)(local_78._0_8_ + 0x90))->_M_dataplus)._M_p;
          sStack_a0 = *(size_type *)(local_78._0_8_ + 0x98);
          local_98 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                      (local_78._0_8_ + 0xd0);
          aStack_90 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                       (local_78._0_8_ + 0xd8);
          args_06.field_1.values_ = in_R9.values_;
          args_06.desc_ = (unsigned_long_long)&local_b8;
          fmt_06.size_ = 0x4dda;
          fmt_06.data_ = (char *)0x23;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_e8,(v11 *)"[{}]message from %s to %s:: size %d",fmt_06,args_06
                    );
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                  &local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if (this->skiplog == true) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_108.values_,(long)paStack_100);
          local_b8._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
        }
        else {
          plVar6 = spdlog::default_logger_raw();
          local_b8.values_ = (value<fmt::v11::context> *)0x0;
          pcStack_b0 = (pointer)0x0;
          local_a8 = (pointer)0x0;
          spdlog::logger::log(plVar6,0.0);
        }
        if (&(local_108.values_)->field_0 != &local_f8) {
          operator_delete(local_108.values_,
                          CONCAT71(local_f8.long_long_value._1_7_,local_f8.bool_value) + 1);
        }
      }
      if ((this->clonedMessageCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_50._8_8_ = local_78._0_8_;
        local_78._0_8_ = (Message *)0x0;
        local_b8.values_ = (value<fmt::v11::context> *)local_50._0_8_;
        (*(this->clonedMessageCallback)._M_invoker)
                  ((_Any_data *)&this->clonedMessageCallback,
                   (TimeRepresentation<count_time<9,_long>_> *)&local_b8,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   (local_50 + 8));
        if ((Message *)local_50._8_8_ != (Message *)0x0) {
          CLI::std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)(local_50 + 8),(Message *)local_50._8_8_);
        }
        local_50._8_8_ = 0;
      }
      if ((Message *)local_78._0_8_ != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)local_78,(Message *)local_78._0_8_);
      }
      bVar2 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl);
    } while (bVar2);
  }
  return;
}

Assistant:

void Tracer::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();

            if (printMessage) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                if (skiplog) {
                    std::cout << valstr << '\n';
                } else {
                    spdlog::info(valstr);
                }
            }
            if (valueCallback) {
                valueCallback(currentTime, sub.getTarget(), val);
            }
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (endpointMessageCallback) {
                endpointMessageCallback(currentTime, ept.getName(), std::move(mess));
            }
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            auto mess = cloneEndpoint->getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from %s to %s:: size %d",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (clonedMessageCallback) {
                clonedMessageCallback(currentTime, std::move(mess));
            }
        }
    }
}